

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObserverPtr.cpp
# Opt level: O2

void Rml::Detail::DeallocateObserverPtrBlockIfEmpty(ObserverPtrBlock *block)

{
  code *pcVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  
  iVar4 = block->num_observers;
  if (iVar4 < 0) {
    bVar3 = Assert("RMLUI_ASSERT(block->num_observers >= 0)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ObserverPtr.cpp"
                   ,0x2a);
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    iVar4 = block->num_observers;
  }
  if ((iVar4 == 0) && (block->pointed_to_object == (void *)0x0)) {
    Pool<Rml::Detail::ObserverPtrBlock>::DestroyAndDeallocate
              ((Pool<Rml::Detail::ObserverPtrBlock> *)(observer_ptr_data + 8),block);
    pcVar2 = observer_ptr_data;
    if ((*observer_ptr_data == '\x01') && (*(int *)(observer_ptr_data + 0x28) == 0)) {
      Pool<Rml::Detail::ObserverPtrBlock>::~Pool
                ((Pool<Rml::Detail::ObserverPtrBlock> *)(observer_ptr_data + 8));
      operator_delete(pcVar2,0x30);
      observer_ptr_data = (char *)0x0;
    }
  }
  return;
}

Assistant:

void Detail::DeallocateObserverPtrBlockIfEmpty(ObserverPtrBlock* block)
{
	RMLUI_ASSERT(block->num_observers >= 0);
	if (block->num_observers == 0 && block->pointed_to_object == nullptr)
	{
		observer_ptr_data->block_pool.DestroyAndDeallocate(block);
		if (observer_ptr_data->is_shutdown && observer_ptr_data->block_pool.GetNumAllocatedObjects() == 0)
		{
			delete observer_ptr_data;
			observer_ptr_data = nullptr;
		}
	}
}